

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O2

void __thiscall Environment::set(Environment *this,string *variable,ResultValue value)

{
  mapped_type *pmVar1;
  __node_base *p_Var2;
  
  p_Var2 = &(this->mScopes)._M_h._M_before_begin;
  while (p_Var2 = p_Var2->_M_nxt, p_Var2 != (__node_base *)0x0) {
    pmVar1 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResultValue>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)(p_Var2 + 2),variable);
    pmVar1->mType = value.mType;
    *(undefined4 *)&pmVar1->field_0x4 = value._4_4_;
    pmVar1->mIntValue = value.mIntValue;
    pmVar1->mFloatValue = value.mFloatValue;
    *(undefined8 *)(pmVar1->mComplexValue)._M_value = value.mComplexValue._M_value._0_8_;
    *(undefined8 *)((pmVar1->mComplexValue)._M_value + 8) = value.mComplexValue._M_value._8_8_;
  }
  return;
}

Assistant:

void Environment::set(std::string variable, ResultValue value) {
	for (auto& current : mScopes) {
		auto& scope = current.second;
		scope.variables()[variable] = value;
	}
}